

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CMU462::Face::getAxes(Face *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  reference pvVar1;
  Size SVar2;
  pointer pHVar3;
  pointer pVVar4;
  reference pvVar5;
  Vector3D local_1b8;
  double local_1a0;
  Vector3D local_198;
  Vector3D local_180;
  _List_const_iterator<CMU462::Vertex> local_168;
  undefined1 local_160 [8];
  Vector3D p1_1;
  _List_const_iterator<CMU462::Vertex> local_140;
  undefined1 local_138 [8];
  Vector3D p0_1;
  HalfedgeCIter h_1;
  Vector3D local_100;
  Vector3D local_e8;
  _List_const_iterator<CMU462::Vertex> local_d0;
  undefined1 local_c8 [8];
  Vector3D p3;
  _List_const_iterator<CMU462::Vertex> local_a8;
  undefined1 local_a0 [8];
  Vector3D p2;
  _List_const_iterator<CMU462::Vertex> local_80;
  undefined1 local_78 [8];
  Vector3D p1;
  _List_const_iterator<CMU462::Vertex> local_58;
  undefined1 local_50 [8];
  Vector3D p0;
  HalfedgeCIter h;
  double local_28;
  double local_20;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes_local;
  Face *this_local;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(axes,3);
  normal((Vector3D *)&h,this);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,2);
  pvVar1->x = (double)h._M_node;
  pvVar1->y = local_28;
  pvVar1->z = local_20;
  SVar2 = degree(this);
  if (SVar2 == 4) {
    p0.z = (double)halfedge(this);
    pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&p0.z);
    local_58._M_node = (_List_node_base *)Halfedge::vertex(pHVar3);
    pVVar4 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_58);
    Vector3D::Vector3D((Vector3D *)local_50,&pVVar4->position);
    pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&p0.z);
    p1.z = (double)Halfedge::next(pHVar3);
    p0.z = p1.z;
    pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&p0.z);
    local_80._M_node = (_List_node_base *)Halfedge::vertex(pHVar3);
    pVVar4 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_80);
    Vector3D::Vector3D((Vector3D *)local_78,&pVVar4->position);
    pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&p0.z);
    p2.z = (double)Halfedge::next(pHVar3);
    p0.z = p2.z;
    pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&p0.z);
    local_a8._M_node = (_List_node_base *)Halfedge::vertex(pHVar3);
    pVVar4 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_a8);
    Vector3D::Vector3D((Vector3D *)local_a0,&pVVar4->position);
    pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&p0.z);
    p3.z = (double)Halfedge::next(pHVar3);
    p0.z = p3.z;
    pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&p0.z);
    local_d0._M_node = (_List_node_base *)Halfedge::vertex(pHVar3);
    pVVar4 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_d0);
    Vector3D::Vector3D((Vector3D *)local_c8,&pVVar4->position);
    Vector3D::operator-(&local_100,(Vector3D *)local_78,(Vector3D *)local_50);
    Vector3D::operator-((Vector3D *)&h_1,(Vector3D *)local_a0,(Vector3D *)local_c8);
    Vector3D::operator+(&local_e8,&local_100,(Vector3D *)&h_1);
    pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,0);
    pvVar1->x = local_e8.x;
    pvVar1->y = local_e8.y;
    pvVar1->z = local_e8.z;
  }
  else {
    p0_1.z = (double)halfedge(this);
    pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&p0_1.z);
    local_140._M_node = (_List_node_base *)Halfedge::vertex(pHVar3);
    pVVar4 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_140);
    Vector3D::Vector3D((Vector3D *)local_138,&pVVar4->position);
    pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&p0_1.z);
    p1_1.z = (double)Halfedge::next(pHVar3);
    p0_1.z = p1_1.z;
    pHVar3 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                       ((_List_const_iterator<CMU462::Halfedge> *)&p0_1.z);
    local_168._M_node = (_List_node_base *)Halfedge::vertex(pHVar3);
    pVVar4 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_168);
    Vector3D::Vector3D((Vector3D *)local_160,&pVVar4->position);
    Vector3D::operator-(&local_180,(Vector3D *)local_160,(Vector3D *)local_138);
    pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,0);
    pvVar1->x = local_180.x;
    pvVar1->y = local_180.y;
    pvVar1->z = local_180.z;
  }
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,0);
  pvVar5 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,2);
  local_1a0 = dot(pvVar1,pvVar5);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,2);
  CMU462::operator*(&local_198,&local_1a0,pvVar1);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,0);
  Vector3D::operator-=(pvVar1,&local_198);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,0);
  Vector3D::normalize(pvVar1);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,2);
  pvVar5 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,0);
  cross(&local_1b8,pvVar1,pvVar5);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](axes,1);
  pvVar1->x = local_1b8.x;
  pvVar1->y = local_1b8.y;
  pvVar1->z = local_1b8.z;
  return;
}

Assistant:

void Face::getAxes( vector<Vector3D>& axes ) const
  {
    axes.resize(3);

    // Set the Z direction to the face normal
    axes[2] = normal();

    if( degree() == 4 )
    {
      // For quads, we'll try to roughly align the X direction
      // with one of the principal axes of the quad.
      HalfedgeCIter h = halfedge();
      Vector3D p0 = h->vertex()->position; h = h->next();
      Vector3D p1 = h->vertex()->position; h = h->next();
      Vector3D p2 = h->vertex()->position; h = h->next();
      Vector3D p3 = h->vertex()->position;

      axes[0] = ( p1 - p0 ) + ( p2 - p3 );
    }
    else
    {
      // Otherwise, we'll just use an arbitrary edge
      // to determine the direction of the X-axis.
      HalfedgeCIter h = halfedge();
      Vector3D p0 = h->vertex()->position; h = h->next();
      Vector3D p1 = h->vertex()->position;

      axes[0] = p1 - p0;
    }

    // Make X orthonormal to Z
    axes[0] -= dot( axes[0], axes[2] )*axes[2];
    axes[0].normalize();

    // Choose the Y direction so that X x Y = Z
    axes[1] = cross( axes[2], axes[0] );
  }